

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexCompileTime.cpp
# Opt level: O1

void __thiscall
UnifiedRegex::MatchLiteralNode::AnnotatePass2
          (MatchLiteralNode *this,Compiler *compiler,CountDomain accumConsumes,
          bool accumPrevWillNotProgress,bool accumPrevWillNotRegress)

{
  undefined7 in_register_00000009;
  undefined7 in_register_00000081;
  
  (this->super_Node).prevConsumes = accumConsumes;
  *(uint *)&(this->super_Node).field_0xc =
       (int)CONCAT71(in_register_00000081,accumPrevWillNotRegress) << 7 |
       (int)CONCAT71(in_register_00000009,accumPrevWillNotProgress) << 6 |
       *(uint *)&(this->super_Node).field_0xc & 0xffffff3f;
  return;
}

Assistant:

void MatchLiteralNode::AnnotatePass2(Compiler& compiler, CountDomain accumConsumes, bool accumPrevWillNotProgress, bool accumPrevWillNotRegress)
    {
        prevConsumes = accumConsumes;
        isPrevWillNotProgress = accumPrevWillNotProgress;
        isPrevWillNotRegress = accumPrevWillNotRegress;
    }